

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitUtils.hpp
# Opt level: O0

SizeT64 Qentem::DigitUtils::DigitConst<8U>::GetPowerOfFive(SizeT32 index)

{
  SizeT32 index_local;
  
  return GetPowerOfFive::PowerOfFive[index];
}

Assistant:

static SizeT64 GetPowerOfFive(SizeT32 index) noexcept {
        static const SizeT64 PowerOfFive[] = {
            // clang-format off
            1ULL,5ULL,25ULL,125ULL,625ULL,3125ULL,15625ULL,78125ULL,390625ULL,1953125ULL,
            9765625ULL,48828125ULL,244140625ULL,1220703125ULL,6103515625ULL,30517578125ULL,
            152587890625ULL,762939453125ULL,3814697265625ULL,19073486328125ULL,95367431640625ULL,
            476837158203125ULL,2384185791015625ULL,11920928955078125ULL,59604644775390625ULL,
            298023223876953125ULL,1490116119384765625ULL,7450580596923828125ULL
            // clang-format on
        };

        return PowerOfFive[index];
    }